

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

void initializer2(C_Parser *parser,C_Token **rest,C_Token *tok,Initializer *init)

{
  char cVar1;
  ushort uVar2;
  TypeKind TVar3;
  uint uVar4;
  C_TokenKind CVar5;
  Initializer **ppIVar6;
  C_Token *pCVar7;
  undefined7 uVar8;
  _Bool _Var9;
  byte bVar10;
  int iVar11;
  C_Type *pCVar12;
  Initializer *pIVar13;
  ulong uVar14;
  C_Node *pCVar15;
  C_Member *pCVar16;
  C_Token *pCVar17;
  Initializer *pIVar18;
  bool bVar19;
  int iVar20;
  ulong uVar21;
  C_Token **rest_00;
  long lVar22;
  int end;
  int begin;
  undefined1 local_60 [32];
  C_Token *local_40;
  C_Token *local_38;
  
  pCVar12 = init->ty;
  TVar3 = pCVar12->kind;
  local_40 = tok;
  if (TVar3 == TY_UNION) {
    local_60._0_8_ = tok;
    _Var9 = C_equal(tok,"{");
    if ((!_Var9) || (_Var9 = C_equal(tok->next,"."), !_Var9)) {
      init->mem = init->ty->members;
      _Var9 = C_equal(tok,"{");
      if (!_Var9) {
        initializer2(parser,rest,tok,*init->children);
        return;
      }
      initializer2(parser,(C_Token **)local_60,tok->next,*init->children);
      C_consume((C_Token **)local_60,(C_Token *)local_60._0_8_,",");
      pCVar17 = (C_Token *)local_60._0_8_;
      goto LAB_0012b026;
    }
    rest_00 = (C_Token **)local_60;
    pCVar16 = struct_designator(parser,rest_00,tok->next,init->ty);
    init->mem = pCVar16;
    designation(parser,rest_00,(C_Token *)local_60._0_8_,init->children[pCVar16->idx]);
  }
  else {
    if (TVar3 == TY_STRUCT) {
      _Var9 = C_equal(tok,"{");
      if (!_Var9) {
        pCVar15 = assign(parser,rest,tok);
        C_add_type(parser,pCVar15);
        if (pCVar15->ty->kind == TY_STRUCT) {
          init->expr = pCVar15;
          return;
        }
        struct_initializer2(parser,rest,tok,init,init->ty->members);
        return;
      }
      local_60._0_8_ = C_skip(parser,tok,"{");
      pCVar16 = init->ty->members;
      _Var9 = consume_end(rest,(C_Token *)local_60._0_8_);
      if (_Var9) {
        return;
      }
      bVar19 = true;
      do {
        if (!bVar19) {
          local_60._0_8_ = C_skip(parser,(C_Token *)local_60._0_8_,",");
        }
        _Var9 = C_equal((C_Token *)local_60._0_8_,".");
        if (_Var9) {
          pCVar16 = struct_designator(parser,(C_Token **)local_60,(C_Token *)local_60._0_8_,init->ty
                                     );
          designation(parser,(C_Token **)local_60,(C_Token *)local_60._0_8_,
                      init->children[pCVar16->idx]);
LAB_0012aefe:
          pCVar16 = pCVar16->next;
        }
        else {
          if (pCVar16 != (C_Member *)0x0) {
            initializer2(parser,(C_Token **)local_60,(C_Token *)local_60._0_8_,
                         init->children[pCVar16->idx]);
            goto LAB_0012aefe;
          }
          local_60._0_8_ = skip_excess_element(parser,(C_Token *)local_60._0_8_);
          pCVar16 = (C_Member *)0x0;
        }
        _Var9 = consume_end(rest,(C_Token *)local_60._0_8_);
        bVar19 = false;
        if (_Var9) {
          return;
        }
      } while( true );
    }
    if (TVar3 == TY_ARRAY) {
      local_60._16_8_ = rest;
      if (tok->kind == TK_STR) {
        if (init->is_flexible == true) {
          pCVar12 = C_array_of(parser,pCVar12->base,tok->ty->array_len);
          pIVar13 = new_initializer(parser,pCVar12,false);
          pCVar12 = pIVar13->ty;
          pCVar17 = pIVar13->tok;
          _Var9 = pIVar13->is_flexible;
          uVar8 = *(undefined7 *)&pIVar13->field_0x19;
          pCVar15 = pIVar13->expr;
          ppIVar6 = pIVar13->children;
          init->next = pIVar13->next;
          init->ty = pCVar12;
          init->tok = pCVar17;
          init->is_flexible = _Var9;
          *(undefined7 *)&init->field_0x19 = uVar8;
          init->expr = pCVar15;
          init->children = ppIVar6;
          init->mem = pIVar13->mem;
          pCVar12 = init->ty;
        }
        uVar4 = tok->ty->array_len;
        if (pCVar12->array_len < (int)uVar4) {
          uVar4 = pCVar12->array_len;
        }
        uVar14 = (ulong)uVar4;
        iVar11 = pCVar12->base->size;
        if (iVar11 == 4) {
          if (0 < (int)uVar4) {
            local_60._8_8_ = tok->str;
            uVar21 = 0;
            do {
              CVar5 = ((C_TokenKind *)local_60._8_8_)[uVar21];
              pCVar15 = (C_Node *)
                        (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120)
              ;
              pCVar15->kind = ND_NUM;
              pCVar15->tok = tok;
              pCVar15->val = (ulong)CVar5;
              init->children[uVar21]->expr = pCVar15;
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
          }
        }
        else if (iVar11 == 2) {
          if (0 < (int)uVar4) {
            local_60._8_8_ = tok->str;
            uVar21 = 0;
            do {
              uVar2 = *(ushort *)((long)(C_TokenKind *)local_60._8_8_ + uVar21 * 2);
              pCVar15 = (C_Node *)
                        (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120)
              ;
              pCVar15->kind = ND_NUM;
              pCVar15->tok = tok;
              pCVar15->val = (ulong)uVar2;
              init->children[uVar21]->expr = pCVar15;
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
          }
        }
        else {
          if (iVar11 != 1) {
            C_error(parser,"internal error at %s:%d",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/chibicc/chibicc_parse.c"
                    ,0x3b4);
          }
          if (0 < (int)uVar4) {
            local_60._8_8_ = tok->str;
            uVar21 = 0;
            do {
              cVar1 = *(char *)((long)(C_TokenKind *)local_60._8_8_ + uVar21);
              pCVar15 = (C_Node *)
                        (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120)
              ;
              pCVar15->kind = ND_NUM;
              pCVar15->tok = tok;
              pCVar15->val = (long)cVar1;
              init->children[uVar21]->expr = pCVar15;
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
          }
        }
        *(C_Token **)local_60._16_8_ = tok->next;
        return;
      }
      _Var9 = C_equal(tok,"{");
      if (!_Var9) {
        array_initializer2(parser,rest,tok,init,0);
        return;
      }
      pCVar17 = C_skip(parser,tok,"{");
      bVar10 = init->is_flexible;
      local_60._0_8_ = pCVar17;
      if ((_Bool)bVar10 == true) {
        iVar11 = count_array_init_elements(parser,pCVar17,init->ty);
        pCVar12 = C_array_of(parser,init->ty->base,iVar11);
        pIVar18 = new_initializer(parser,pCVar12,false);
        pIVar13 = pIVar18->next;
        pCVar12 = pIVar18->ty;
        _Var9 = pIVar18->is_flexible;
        uVar8 = *(undefined7 *)&pIVar18->field_0x19;
        pCVar15 = pIVar18->expr;
        ppIVar6 = pIVar18->children;
        init->tok = pIVar18->tok;
        init->is_flexible = _Var9;
        *(undefined7 *)&init->field_0x19 = uVar8;
        init->next = pIVar13;
        init->ty = pCVar12;
        init->expr = pCVar15;
        init->children = ppIVar6;
        init->mem = pIVar18->mem;
        bVar10 = init->is_flexible;
      }
      if ((bVar10 & 1) != 0) {
        iVar11 = count_array_init_elements(parser,pCVar17,init->ty);
        pCVar12 = C_array_of(parser,init->ty->base,iVar11);
        pIVar13 = new_initializer(parser,pCVar12,false);
        pCVar12 = pIVar13->ty;
        pCVar7 = pIVar13->tok;
        _Var9 = pIVar13->is_flexible;
        uVar8 = *(undefined7 *)&pIVar13->field_0x19;
        pCVar15 = pIVar13->expr;
        ppIVar6 = pIVar13->children;
        init->next = pIVar13->next;
        init->ty = pCVar12;
        init->tok = pCVar7;
        init->is_flexible = _Var9;
        *(undefined7 *)&init->field_0x19 = uVar8;
        init->expr = pCVar15;
        init->children = ppIVar6;
        init->mem = pIVar13->mem;
      }
      _Var9 = consume_end(rest,pCVar17);
      if (_Var9) {
        return;
      }
      bVar19 = true;
      iVar11 = 0;
      do {
        if (!bVar19) {
          local_60._0_8_ = C_skip(parser,(C_Token *)local_60._0_8_,",");
        }
        _Var9 = C_equal((C_Token *)local_60._0_8_,"[");
        if (_Var9) {
          pCVar17 = (C_Token *)local_60;
          array_designator(parser,(C_Token **)pCVar17,(C_Token *)local_60._0_8_,init->ty,
                           (int *)(local_60 + 0x1c),(int *)(local_60 + 0x18));
          iVar11 = local_60._24_4_;
          lVar22 = (long)(int)local_60._28_4_;
          if ((int)local_60._28_4_ <= (int)local_60._24_4_) {
            iVar20 = (local_60._24_4_ - local_60._28_4_) + 1;
            do {
              designation(parser,&local_38,(C_Token *)local_60._0_8_,init->children[lVar22]);
              lVar22 = lVar22 + 1;
              iVar20 = iVar20 + -1;
              rest = (C_Token **)local_60._16_8_;
              pCVar17 = local_38;
            } while (iVar20 != 0);
          }
        }
        else if (iVar11 < init->ty->array_len) {
          initializer2(parser,(C_Token **)local_60,(C_Token *)local_60._0_8_,init->children[iVar11])
          ;
          pCVar17 = (C_Token *)local_60._0_8_;
        }
        else {
          pCVar17 = skip_excess_element(parser,(C_Token *)local_60._0_8_);
        }
        local_60._0_8_ = pCVar17;
        iVar11 = iVar11 + 1;
        _Var9 = consume_end(rest,(C_Token *)local_60._0_8_);
        bVar19 = false;
      } while (!_Var9);
      return;
    }
    _Var9 = C_equal(tok,"{");
    if (!_Var9) {
      pCVar15 = assign(parser,rest,tok);
      init->expr = pCVar15;
      return;
    }
    rest_00 = &local_40;
    initializer2(parser,rest_00,tok->next,init);
  }
  pCVar17 = *rest_00;
LAB_0012b026:
  pCVar17 = C_skip(parser,pCVar17,"}");
  *rest = pCVar17;
  return;
}

Assistant:

static void initializer2(C_Parser *parser, C_Token **rest, C_Token *tok, Initializer *init) {
  if (init->ty->kind == TY_ARRAY && tok->kind == TK_STR) {
    string_initializer(parser, rest, tok, init);
    return;
  }

  if (init->ty->kind == TY_ARRAY) {
    if (C_equal(tok, "{"))
      array_initializer1(parser, rest, tok, init);
    else
      array_initializer2(parser, rest, tok, init, 0);
    return;
  }

  if (init->ty->kind == TY_STRUCT) {
    if (C_equal(tok, "{")) {
      struct_initializer1(parser, rest, tok, init);
      return;
    }

    // A struct can be initialized with another struct. E.g.
    // `struct T x = y;` where y is a variable of type `struct T`.
    // Handle that case first.
    C_Node *expr = assign(parser, rest, tok);
    C_add_type(parser, expr);
    if (expr->ty->kind == TY_STRUCT) {
      init->expr = expr;
      return;
    }

    struct_initializer2(parser, rest, tok, init, init->ty->members);
    return;
  }

  if (init->ty->kind == TY_UNION) {
    union_initializer(parser, rest, tok, init);
    return;
  }

  if (C_equal(tok, "{")) {
    // An initializer for a scalar variable can be surrounded by
    // braces. E.g. `int x = {3};`. Handle that case.
    initializer2(parser, &tok, tok->next, init);
    *rest = C_skip(parser, tok, "}");
    return;
  }

  init->expr = assign(parser, rest, tok);
}